

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O3

void __thiscall
btQuantizedBvh::walkStacklessTree
          (btQuantizedBvh *this,btNodeOverlapCallback *nodeCallback,btVector3 *aabbMin,
          btVector3 *aabbMax)

{
  btScalar *pbVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  btOptimizedBvhNode *pbVar5;
  int iVar6;
  bool bVar7;
  
  if (this->m_curNodeIndex < 1) {
    iVar4 = 0;
  }
  else {
    pbVar5 = (this->m_contiguousNodes).m_data;
    iVar6 = 0;
    iVar4 = 0;
    do {
      if (((pbVar5->m_aabbMaxOrg).m_floats[0] <= aabbMin->m_floats[0] &&
           aabbMin->m_floats[0] != (pbVar5->m_aabbMaxOrg).m_floats[0]) ||
         (fVar2 = (pbVar5->m_aabbMinOrg).m_floats[0],
         aabbMax->m_floats[0] <= fVar2 && fVar2 != aabbMax->m_floats[0])) {
        bVar3 = 0;
      }
      else {
        bVar3 = 1;
      }
      pbVar1 = (pbVar5->m_aabbMaxOrg).m_floats + 2;
      if ((*pbVar1 <= aabbMin->m_floats[2] && aabbMin->m_floats[2] != *pbVar1) ||
         (fVar2 = (pbVar5->m_aabbMinOrg).m_floats[2],
         aabbMax->m_floats[2] <= fVar2 && fVar2 != aabbMax->m_floats[2])) {
        bVar3 = 0;
      }
      pbVar1 = (pbVar5->m_aabbMaxOrg).m_floats + 1;
      if ((*pbVar1 <= aabbMin->m_floats[1] && aabbMin->m_floats[1] != *pbVar1) ||
         (fVar2 = (pbVar5->m_aabbMinOrg).m_floats[1],
         aabbMax->m_floats[1] <= fVar2 && fVar2 != aabbMax->m_floats[1])) {
        bVar7 = pbVar5->m_escapeIndex == -1;
        bVar3 = 0;
LAB_00139a76:
        if ((bool)(bVar7 | bVar3)) goto LAB_00139ab0;
        iVar6 = iVar6 + pbVar5->m_escapeIndex;
        pbVar5 = pbVar5 + pbVar5->m_escapeIndex;
      }
      else {
        bVar7 = pbVar5->m_escapeIndex == -1;
        if (!(bool)(bVar3 & bVar7)) goto LAB_00139a76;
        (*nodeCallback->_vptr_btNodeOverlapCallback[2])
                  (nodeCallback,(ulong)(uint)pbVar5->m_subPart,(ulong)(uint)pbVar5->m_triangleIndex)
        ;
LAB_00139ab0:
        pbVar5 = pbVar5 + 1;
        iVar6 = iVar6 + 1;
      }
      iVar4 = iVar4 + 1;
    } while (iVar6 < this->m_curNodeIndex);
  }
  if (maxIterations < iVar4) {
    maxIterations = iVar4;
  }
  return;
}

Assistant:

void	btQuantizedBvh::walkStacklessTree(btNodeOverlapCallback* nodeCallback,const btVector3& aabbMin,const btVector3& aabbMax) const
{
	btAssert(!m_useQuantization);

	const btOptimizedBvhNode* rootNode = &m_contiguousNodes[0];
	int escapeIndex, curIndex = 0;
	int walkIterations = 0;
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	while (curIndex < m_curNodeIndex)
	{
		//catch bugs in tree data
		btAssert (walkIterations < m_curNodeIndex);

		walkIterations++;
		aabbOverlap = TestAabbAgainstAabb2(aabbMin,aabbMax,rootNode->m_aabbMinOrg,rootNode->m_aabbMaxOrg);
		isLeafNode = rootNode->m_escapeIndex == -1;
		
		//PCK: unsigned instead of bool
		if (isLeafNode && (aabbOverlap != 0))
		{
			nodeCallback->processNode(rootNode->m_subPart,rootNode->m_triangleIndex);
		} 
		
		//PCK: unsigned instead of bool
		if ((aabbOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		} else
		{
			escapeIndex = rootNode->m_escapeIndex;
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;

}